

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

void __thiscall spirv_cross::Compiler::analyze_non_block_pointer_types(Compiler *this)

{
  ParsedIR *this_00;
  SmallVector<unsigned_int,_8UL> *this_01;
  uint id;
  TypedID<(spirv_cross::Types)0> *pTVar1;
  size_t sVar2;
  uint *puVar3;
  Compiler *pCVar4;
  bool bVar5;
  SPIRFunction *func;
  SPIRType *type_00;
  long lVar6;
  __node_base *p_Var7;
  uint type;
  Compiler *local_f0;
  PhysicalStorageBufferPointerHandler handler;
  
  handler.non_block_types._M_h._M_buckets = &handler.non_block_types._M_h._M_single_bucket;
  handler.super_OpcodeHandler._vptr_OpcodeHandler =
       (_func_int **)&PTR__PhysicalStorageBufferPointerHandler_004653d0;
  handler.non_block_types._M_h._M_bucket_count = 1;
  handler.non_block_types._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  handler.non_block_types._M_h._M_element_count = 0;
  handler.non_block_types._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  handler.non_block_types._M_h._M_rehash_policy._M_next_resize = 0;
  handler.non_block_types._M_h._M_single_bucket = (__node_base_ptr)0x0;
  handler.physical_block_type_meta._M_h._M_buckets =
       &handler.physical_block_type_meta._M_h._M_single_bucket;
  handler.physical_block_type_meta._M_h._M_bucket_count = 1;
  handler.physical_block_type_meta._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  handler.physical_block_type_meta._M_h._M_element_count = 0;
  handler.physical_block_type_meta._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  handler.physical_block_type_meta._M_h._M_rehash_policy._M_next_resize = 0;
  handler.physical_block_type_meta._M_h._M_single_bucket = (__node_base_ptr)0x0;
  handler.access_chain_to_physical_block._M_h._M_buckets =
       &handler.access_chain_to_physical_block._M_h._M_single_bucket;
  handler.access_chain_to_physical_block._M_h._M_bucket_count = 1;
  handler.access_chain_to_physical_block._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  handler.access_chain_to_physical_block._M_h._M_element_count = 0;
  handler.access_chain_to_physical_block._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  handler.access_chain_to_physical_block._M_h._M_rehash_policy._M_next_resize = 0;
  handler.access_chain_to_physical_block._M_h._M_single_bucket = (__node_base_ptr)0x0;
  handler.compiler = this;
  func = get<spirv_cross::SPIRFunction>(this,(this->ir).default_entry_point.id);
  traverse_all_reachable_opcodes(this,func,&handler.super_OpcodeHandler);
  this_00 = &this->ir;
  ParsedIR::create_loop_hard_lock(this_00);
  p_Var7 = &handler.non_block_types._M_h._M_before_begin;
  pTVar1 = (this->ir).ids_for_type[1].super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>
           .ptr;
  sVar2 = (this->ir).ids_for_type[1].super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.
          buffer_size;
  lVar6 = 0;
  local_f0 = this;
  do {
    if (sVar2 << 2 == lVar6) {
      ParsedIR::LoopLock::~LoopLock((LoopLock *)&type);
      pCVar4 = local_f0;
      this_01 = &local_f0->physical_storage_non_block_pointer_types;
      SmallVector<unsigned_int,_8UL>::reserve(this_01,handler.non_block_types._M_h._M_element_count)
      ;
      while (p_Var7 = p_Var7->_M_nxt, p_Var7 != (__node_base *)0x0) {
        type = (uint)*(size_type *)(p_Var7 + 1);
        SmallVector<unsigned_int,_8UL>::push_back(this_01,&type);
      }
      puVar3 = (pCVar4->physical_storage_non_block_pointer_types).super_VectorView<unsigned_int>.ptr
      ;
      ::std::__sort<unsigned_int*,__gnu_cxx::__ops::_Iter_less_iter>
                (puVar3,puVar3 + (pCVar4->physical_storage_non_block_pointer_types).
                                 super_VectorView<unsigned_int>.buffer_size);
      ::std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::Compiler::PhysicalBlockMeta>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::Compiler::PhysicalBlockMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::operator=(&(pCVar4->physical_storage_type_to_alignment)._M_h,
                  &handler.physical_block_type_meta._M_h);
      PhysicalStorageBufferPointerHandler::~PhysicalStorageBufferPointerHandler(&handler);
      return;
    }
    id = *(uint *)((long)&pTVar1->id + lVar6);
    if ((local_f0->ir).ids.super_VectorView<spirv_cross::Variant>.ptr[id].type == TypeType) {
      type_00 = ParsedIR::get<spirv_cross::SPIRType>(this_00,id);
      bVar5 = ParsedIR::has_decoration
                        (this_00,(ID)(type_00->super_IVariant).self.id,DecorationBlock);
      if (!bVar5) {
        bVar5 = ParsedIR::has_decoration
                          (this_00,(ID)(type_00->super_IVariant).self.id,DecorationBufferBlock);
        if (!bVar5) goto LAB_00379988;
      }
      PhysicalStorageBufferPointerHandler::analyze_non_block_types_from_block(&handler,type_00);
    }
LAB_00379988:
    lVar6 = lVar6 + 4;
  } while( true );
}

Assistant:

void Compiler::analyze_non_block_pointer_types()
{
	PhysicalStorageBufferPointerHandler handler(*this);
	traverse_all_reachable_opcodes(get<SPIRFunction>(ir.default_entry_point), handler);

	// Analyze any block declaration we have to make. It might contain
	// physical pointers to POD types which we never used, and thus never added to the list.
	// We'll need to add those pointer types to the set of types we declare.
	ir.for_each_typed_id<SPIRType>([&](uint32_t, SPIRType &type) {
		if (has_decoration(type.self, DecorationBlock) || has_decoration(type.self, DecorationBufferBlock))
			handler.analyze_non_block_types_from_block(type);
	});

	physical_storage_non_block_pointer_types.reserve(handler.non_block_types.size());
	for (auto type : handler.non_block_types)
		physical_storage_non_block_pointer_types.push_back(type);
	sort(begin(physical_storage_non_block_pointer_types), end(physical_storage_non_block_pointer_types));
	physical_storage_type_to_alignment = std::move(handler.physical_block_type_meta);
}